

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

mfp_kernel_1_base_class<1UL> * __thiscall
dlib::mfp_kernel_1_base_class<1UL>::operator=
          (mfp_kernel_1_base_class<1UL> *this,mfp_kernel_1_base_class<1UL> *item)

{
  mfp_kernel_1_base_class<1UL> *in_RDI;
  mfp_kernel_1_base_class<1UL> *unaff_retaddr;
  mfp_kernel_1_base_class<1UL> *in_stack_ffffffffffffff98;
  mfp_kernel_1_base_class<1UL> *in_stack_ffffffffffffffa0;
  mfp_kernel_1_base_class<1UL> *item_00;
  
  item_00 = in_RDI;
  mfp_kernel_1_base_class(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  swap(unaff_retaddr,item_00);
  ~mfp_kernel_1_base_class((mfp_kernel_1_base_class<1UL> *)0x29fde5);
  return in_RDI;
}

Assistant:

mfp_kernel_1_base_class& operator= (
            const mfp_kernel_1_base_class& item
        ) { mfp_kernel_1_base_class(item).swap(*this); return *this;  }